

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenEnumDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,FieldDef *field)

{
  size_type *psVar1;
  EnumDef *this_00;
  pointer pcVar2;
  EnumVal *name;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  string local_68;
  string local_48;
  
  this_00 = (field->value).type.enum_def;
  if (this_00 == (EnumDef *)0x0) {
    __assert_fail("value.type.enum_def",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_csharp.cpp"
                  ,0x149,
                  "std::string flatbuffers::csharp::CSharpGenerator::GenEnumDefaultValue(const FieldDef &) const"
                 );
  }
  name = EnumDef::FindByValue(this_00,&(field->value).constant);
  if (name == (EnumVal *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (field->value).constant._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (field->value).constant._M_string_length);
    return __return_storage_ptr__;
  }
  NamespacedName_abi_cxx11_(&local_48,this,&this_00->super_Definition);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_78 = *puVar5;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar5;
    local_88 = (ulong *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  EscapeKeyword(&local_68,this,&name->name);
  uVar6 = 0xf;
  if (local_88 != &local_78) {
    uVar6 = local_78;
  }
  if (uVar6 < local_68._M_string_length + local_80) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar7 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_80 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_001be97b;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
LAB_001be97b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar7 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenEnumDefaultValue(const FieldDef &field) const {
    auto &value = field.value;
    FLATBUFFERS_ASSERT(value.type.enum_def);
    auto &enum_def = *value.type.enum_def;
    auto enum_val = enum_def.FindByValue(value.constant);
    return enum_val ? (NamespacedName(enum_def) + "." + Name(*enum_val))
                    : value.constant;
  }